

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_51(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar1;
  bool bVar2;
  int iVar3;
  QPDFWriter local_370 [8];
  QPDFWriter w;
  allocator<char> local_359;
  string local_358 [32];
  QPDFObjectHandle local_338;
  QPDFObjectHandle local_328;
  undefined1 local_318 [8];
  QPDFFormFieldObjectHelper foh_3;
  string local_2d8 [32];
  QPDFObjectHandle local_2b8;
  QPDFObjectHandle local_2a8;
  undefined1 local_298 [8];
  QPDFFormFieldObjectHelper foh_2;
  string local_258 [32];
  QPDFObjectHandle local_238;
  QPDFObjectHandle local_228;
  undefined1 local_218 [8];
  QPDFFormFieldObjectHelper foh_1;
  string local_1d8 [32];
  QPDFObjectHandle local_1b8;
  QPDFObjectHandle local_1a8;
  allocator<char> local_191;
  string local_190 [32];
  QPDFObjectHandle local_170;
  QPDFObjectHandle local_160;
  undefined1 local_150 [8];
  QPDFFormFieldObjectHelper foh;
  string Tval;
  string local_f0 [32];
  undefined1 local_d0 [8];
  QPDFObjectHandle T;
  QPDFObjectHandle field;
  int i;
  int nitems;
  undefined1 local_80 [8];
  QPDFObjectHandle fields;
  allocator<char> local_59;
  string local_58 [32];
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  QPDFObjectHandle acroform;
  char *arg2_local;
  QPDF *pdf_local;
  
  acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/AcroForm",&local_59);
  QPDFObjectHandle::getKey((string *)local_28);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nitems,"/Fields",(allocator<char> *)((long)&i + 3));
  QPDFObjectHandle::getKey((string *)local_80);
  std::__cxx11::string::~string((string *)&nitems);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  iVar3 = QPDFObjectHandle::getArrayNItems();
  for (field.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._4_4_ = 0;
      field.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ < iVar3;
      field.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ =
           field.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_ + 1) {
    QPDFObjectHandle::getArrayItem((int)&T + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_f0,"/T",(allocator<char> *)(Tval.field_2._M_local_buf + 0xf));
    QPDFObjectHandle::getKey((string *)local_d0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)(Tval.field_2._M_local_buf + 0xf));
    bVar1 = QPDFObjectHandle::isString();
    if ((bVar1 & 1) == 0) {
      Tval.field_2._8_4_ = 4;
    }
    else {
      QPDFObjectHandle::getUTF8Value_abi_cxx11_();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &foh.m.
                               super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,"r1");
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"setting r1 via parent\n");
        QPDFObjectHandle::QPDFObjectHandle
                  (&local_160,
                   (QPDFObjectHandle *)
                   &T.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)local_150,(QPDFObjectHandle *)&local_160);
        QPDFObjectHandle::~QPDFObjectHandle(&local_160);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_190,"/2",&local_191);
        QPDFObjectHandle::newName((string *)&local_170);
        QPDFFormFieldObjectHelper::setV((QPDFObjectHandle *)local_150,SUB81(&local_170,0));
        QPDFObjectHandle::~QPDFObjectHandle(&local_170);
        std::__cxx11::string::~string(local_190);
        std::allocator<char>::~allocator(&local_191);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)local_150);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&foh.m.
                                  super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,"r2");
        if (bVar2) {
          std::operator<<((ostream *)&std::cout,"setting r2 via child\n");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_1d8,"/Kids",
                     (allocator<char> *)
                     ((long)&foh_1.m.
                             super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          QPDFObjectHandle::getKey((string *)&local_1b8);
          QPDFObjectHandle::getArrayItem((int)&local_1a8);
          this = &T.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
          QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_1a8);
          QPDFObjectHandle::~QPDFObjectHandle(&local_1a8);
          QPDFObjectHandle::~QPDFObjectHandle(&local_1b8);
          std::__cxx11::string::~string(local_1d8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&foh_1.m.
                             super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          QPDFObjectHandle::QPDFObjectHandle(&local_228,(QPDFObjectHandle *)this);
          QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                    ((QPDFFormFieldObjectHelper *)local_218,(QPDFObjectHandle *)&local_228);
          QPDFObjectHandle::~QPDFObjectHandle(&local_228);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_258,"/3",
                     (allocator<char> *)
                     ((long)&foh_2.m.
                             super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          QPDFObjectHandle::newName((string *)&local_238);
          QPDFFormFieldObjectHelper::setV((QPDFObjectHandle *)local_218,SUB81(&local_238,0));
          QPDFObjectHandle::~QPDFObjectHandle(&local_238);
          std::__cxx11::string::~string(local_258);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&foh_2.m.
                             super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                    ((QPDFFormFieldObjectHelper *)local_218);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&foh.m.
                                      super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,"checkbox1");
          if (bVar2) {
            std::operator<<((ostream *)&std::cout,"turning checkbox1 on\n");
            QPDFObjectHandle::QPDFObjectHandle
                      (&local_2a8,
                       (QPDFObjectHandle *)
                       &T.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                      ((QPDFFormFieldObjectHelper *)local_298,(QPDFObjectHandle *)&local_2a8);
            QPDFObjectHandle::~QPDFObjectHandle(&local_2a8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_2d8,"/Sure",
                       (allocator<char> *)
                       ((long)&foh_3.m.
                               super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 7));
            QPDFObjectHandle::newName((string *)&local_2b8);
            QPDFFormFieldObjectHelper::setV((QPDFObjectHandle *)local_298,SUB81(&local_2b8,0));
            QPDFObjectHandle::~QPDFObjectHandle(&local_2b8);
            std::__cxx11::string::~string(local_2d8);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&foh_3.m.
                               super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 7));
            QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                      ((QPDFFormFieldObjectHelper *)local_298);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&foh.m.
                                        super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,"checkbox2");
            if (bVar2) {
              std::operator<<((ostream *)&std::cout,"turning checkbox2 off\n");
              QPDFObjectHandle::QPDFObjectHandle
                        (&local_328,
                         (QPDFObjectHandle *)
                         &T.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
              QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                        ((QPDFFormFieldObjectHelper *)local_318,(QPDFObjectHandle *)&local_328);
              QPDFObjectHandle::~QPDFObjectHandle(&local_328);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>(local_358,"/Off",&local_359);
              QPDFObjectHandle::newName((string *)&local_338);
              QPDFFormFieldObjectHelper::setV((QPDFObjectHandle *)local_318,SUB81(&local_338,0));
              QPDFObjectHandle::~QPDFObjectHandle(&local_338);
              std::__cxx11::string::~string(local_358);
              std::allocator<char>::~allocator(&local_359);
              QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                        ((QPDFFormFieldObjectHelper *)local_318);
            }
          }
        }
      }
      std::__cxx11::string::~string
                ((string *)
                 &foh.m.
                  super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      Tval.field_2._8_4_ = 0;
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d0);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &T.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  QPDFWriter::QPDFWriter(local_370,pdf,"a.pdf");
  QPDFWriter::setQDFMode(SUB81(local_370,0));
  QPDFWriter::setStaticID(SUB81(local_370,0));
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_370);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_80);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return;
}

Assistant:

static void
test_51(QPDF& pdf, char const* arg2)
{
    // Test radio button and checkbox field setting. The input
    // files must have radios button called r1 and r2 and
    // checkboxes called checkbox1 and checkbox2. The files
    // button-set*.pdf are designed for this test case.
    QPDFObjectHandle acroform = pdf.getRoot().getKey("/AcroForm");
    QPDFObjectHandle fields = acroform.getKey("/Fields");
    int nitems = fields.getArrayNItems();
    for (int i = 0; i < nitems; ++i) {
        QPDFObjectHandle field = fields.getArrayItem(i);
        QPDFObjectHandle T = field.getKey("/T");
        if (!T.isString()) {
            continue;
        }
        std::string Tval = T.getUTF8Value();
        if (Tval == "r1") {
            std::cout << "setting r1 via parent\n";
            QPDFFormFieldObjectHelper foh(field);
            foh.setV(QPDFObjectHandle::newName("/2"));
        } else if (Tval == "r2") {
            std::cout << "setting r2 via child\n";
            field = field.getKey("/Kids").getArrayItem(1);
            QPDFFormFieldObjectHelper foh(field);
            foh.setV(QPDFObjectHandle::newName("/3"));
        } else if (Tval == "checkbox1") {
            std::cout << "turning checkbox1 on\n";
            QPDFFormFieldObjectHelper foh(field);
            // The value that eventually gets set is based on what's allowed in /N and may not match
            // this value.
            foh.setV(QPDFObjectHandle::newName("/Sure"));
        } else if (Tval == "checkbox2") {
            std::cout << "turning checkbox2 off\n";
            QPDFFormFieldObjectHelper foh(field);
            foh.setV(QPDFObjectHandle::newName("/Off"));
        }
    }
    QPDFWriter w(pdf, "a.pdf");
    w.setQDFMode(true);
    w.setStaticID(true);
    w.write();
}